

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

int Abc_RecToGia3(Gia_Man_t *pMan,If_Man_t *pIfMan,If_Cut_t *pCut,Vec_Int_t *vLeaves,int fHash)

{
  Lms_Man_t *pLVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  word *t;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  bool bVar9;
  int local_8c;
  int nLeaves;
  int BestPo;
  int uSupport;
  int i;
  Gia_Obj_t *pGiaTemp;
  Gia_Obj_t *pGiaPo;
  Gia_Man_t *pGia;
  int iGiaObj;
  int iFan1;
  int iFan0;
  uint uCanonPhase;
  char pCanonPerm [16];
  Lms_Man_t *p;
  int fHash_local;
  Vec_Int_t *vLeaves_local;
  If_Cut_t *pCut_local;
  If_Man_t *pIfMan_local;
  Gia_Man_t *pMan_local;
  
  pLVar1 = s_pMan3;
  pGiaPo = (Gia_Obj_t *)s_pMan3->pGia;
  _uSupport = (Gia_Obj_t *)0x0;
  local_8c = -1;
  iVar2 = If_CutLeaveNum(pCut);
  if (pIfMan->pPars->fCutMin != 1) {
    __assert_fail("pIfMan->pPars->fCutMin == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x45a,"int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)")
    ;
  }
  iVar3 = Vec_IntSize(vLeaves);
  if (iVar2 != iVar3) {
    __assert_fail("nLeaves == Vec_IntSize(vLeaves)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x45b,"int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)")
    ;
  }
  t = If_CutTruthW(pIfMan,pCut);
  nLeaves = Abc_TtSupport(t,iVar2);
  if (nLeaves == 0) {
    iVar2 = If_CutTruthIsCompl(pCut);
    pMan_local._4_4_ = Abc_LitNotCond(0,iVar2);
  }
  else {
    iVar3 = Abc_TtSuppIsMinBase(nLeaves);
    if ((iVar3 == 0) || (nLeaves == 1)) {
      iVar2 = Abc_TtSuppOnlyOne(nLeaves);
      if (iVar2 == 0) {
        __assert_fail("Abc_TtSuppOnlyOne(uSupport)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                      ,0x463,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      iVar2 = Abc_TtSuppFindFirst(nLeaves);
      iVar2 = Vec_IntEntry(vLeaves,iVar2);
      iVar3 = If_CutTruthIsCompl(pCut);
      pMan_local._4_4_ = Abc_LitNotCond(iVar2,iVar3);
    }
    else {
      iVar3 = Gia_WordCountOnes(nLeaves);
      if (iVar3 != iVar2) {
        __assert_fail("Gia_WordCountOnes(uSupport) == nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                      ,0x466,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      If_CutFindBestStruct(pIfMan,pCut,(char *)&iFan0,(uint *)&iFan1,&local_8c);
      if (local_8c < 0) {
        __assert_fail("BestPo >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                      ,0x46a,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      pGiaTemp = Gia_ManCo((Gia_Man_t *)pGiaPo,local_8c);
      if (*(long *)&pGiaPo[0x36].Value == 0) {
        pVVar6 = Vec_IntAlloc(0x100);
        *(Vec_Int_t **)&pGiaPo[0x36].Value = pVVar6;
      }
      pGVar7 = Gia_ObjFanin0(pGiaTemp);
      iVar3 = Gia_ObjIsAnd(pGVar7);
      pGVar7 = pGiaPo;
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                      ,0x470,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      pGVar8 = Gia_ObjFanin0(pGiaTemp);
      Gia_ObjCollectInternal((Gia_Man_t *)pGVar7,pGVar8);
      iVar3 = Vec_IntSize(*(Vec_Int_t **)&pGiaPo[0x36].Value);
      if (iVar3 < 1) {
        __assert_fail("Vec_IntSize(pGia->vTtNodes) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                      ,0x472,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      Vec_IntClear(pLVar1->vLabels);
      for (BestPo = 0; BestPo < iVar2; BestPo = BestPo + 1) {
        pVVar6 = pLVar1->vLabels;
        iVar3 = Vec_IntEntry(vLeaves,(int)*(char *)((long)&iFan0 + (long)BestPo));
        iVar3 = Abc_LitNotCond(iVar3,(uint)iFan1 >> ((byte)BestPo & 0x1f) & 1);
        Vec_IntPush(pVVar6,iVar3);
      }
      BestPo = 0;
      while( true ) {
        iVar3 = BestPo;
        iVar4 = Vec_IntSize(*(Vec_Int_t **)&pGiaPo[0x36].Value);
        pGVar7 = pGiaPo;
        bVar9 = false;
        if (iVar3 < iVar4) {
          iVar3 = Vec_IntEntry(*(Vec_Int_t **)&pGiaPo[0x36].Value,BestPo);
          _uSupport = Gia_ManObj((Gia_Man_t *)pGVar7,iVar3);
          bVar9 = _uSupport != (Gia_Obj_t *)0x0;
        }
        if (!bVar9) break;
        *(ulong *)_uSupport = *(ulong *)_uSupport & 0xffffffffbfffffff;
        pGVar7 = Gia_ObjFanin0(_uSupport);
        iVar3 = Gia_ObjIsAnd(pGVar7);
        pGVar7 = pGiaPo;
        if (iVar3 == 0) {
          pVVar6 = pLVar1->vLabels;
          pGVar7 = Gia_ObjFanin0(_uSupport);
          iVar3 = Gia_ObjCioId(pGVar7);
          iGiaObj = Vec_IntEntry(pVVar6,iVar3);
        }
        else {
          pVVar6 = pLVar1->vLabels;
          pGVar8 = Gia_ObjFanin0(_uSupport);
          iVar3 = Gia_ObjNum((Gia_Man_t *)pGVar7,pGVar8);
          iGiaObj = Vec_IntEntry(pVVar6,iVar3 + iVar2);
        }
        iVar3 = iGiaObj;
        iVar4 = Gia_ObjFaninC0(_uSupport);
        iGiaObj = Abc_LitNotCond(iVar3,iVar4);
        pGVar7 = Gia_ObjFanin1(_uSupport);
        iVar3 = Gia_ObjIsAnd(pGVar7);
        pGVar7 = pGiaPo;
        if (iVar3 == 0) {
          pVVar6 = pLVar1->vLabels;
          pGVar7 = Gia_ObjFanin1(_uSupport);
          iVar3 = Gia_ObjCioId(pGVar7);
          pGia._4_4_ = Vec_IntEntry(pVVar6,iVar3);
        }
        else {
          pVVar6 = pLVar1->vLabels;
          pGVar8 = Gia_ObjFanin1(_uSupport);
          iVar3 = Gia_ObjNum((Gia_Man_t *)pGVar7,pGVar8);
          pGia._4_4_ = Vec_IntEntry(pVVar6,iVar3 + iVar2);
        }
        iVar3 = pGia._4_4_;
        iVar4 = Gia_ObjFaninC1(_uSupport);
        pGia._4_4_ = Abc_LitNotCond(iVar3,iVar4);
        if (fHash == 0) {
          pGia._0_4_ = Gia_ManAppendAnd(pMan,iGiaObj,pGia._4_4_);
        }
        else {
          pGia._0_4_ = Gia_ManHashAnd(pMan,iGiaObj,pGia._4_4_);
        }
        Vec_IntPush(pLVar1->vLabels,(int)pGia);
        BestPo = BestPo + 1;
      }
      iVar3 = Gia_ObjIsAnd(_uSupport);
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsAnd(pGiaTemp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                      ,0x48e,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      pVVar6 = pLVar1->vLabels;
      iVar3 = Gia_ObjNum((Gia_Man_t *)pGiaPo,_uSupport);
      iVar3 = Vec_IntEntry(pVVar6,iVar3 + iVar2);
      pGia._0_4_ = iVar3;
      uVar5 = Gia_ObjFaninC0(pGiaTemp);
      pMan_local._4_4_ =
           Abc_LitNotCond(iVar3,uVar5 ^ (uint)iFan1 >> ((byte)iVar2 & 0x1f) & 1 ^
                                *(uint *)&pCut->field_0x1c >> 0xc & 1);
    }
  }
  return pMan_local._4_4_;
}

Assistant:

int Abc_RecToGia3( Gia_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, Vec_Int_t * vLeaves, int fHash )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    int iFan0, iFan1, iGiaObj;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pGiaPo, * pGiaTemp = NULL;
    int i, uSupport, BestPo = -1, nLeaves = If_CutLeaveNum(pCut);
    assert( pIfMan->pPars->fCutMin == 1 );
    assert( nLeaves == Vec_IntSize(vLeaves) );

    // compute support
    uSupport = Abc_TtSupport( If_CutTruthW(pIfMan, pCut), nLeaves );
    if ( uSupport == 0 )
        return Abc_LitNotCond( 0, If_CutTruthIsCompl(pCut) );
    if ( !Abc_TtSuppIsMinBase(uSupport) || uSupport == 1 )
    {
        assert( Abc_TtSuppOnlyOne(uSupport) );
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, Abc_TtSuppFindFirst(uSupport)), If_CutTruthIsCompl(pCut) );
    }
    assert( Gia_WordCountOnes(uSupport) == nLeaves );

    // get the best output for this node
    If_CutFindBestStruct( pIfMan, pCut, pCanonPerm, &uCanonPhase, &BestPo );
    assert( BestPo >= 0 );
    pGiaPo = Gia_ManCo( pGia, BestPo );

    // collect internal nodes into pGia->vTtNodes
    if ( pGia->vTtNodes == NULL )
        pGia->vTtNodes = Vec_IntAlloc( 256 );
    assert( Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) ) );
    Gia_ObjCollectInternal( pGia, Gia_ObjFanin0(pGiaPo) );
    assert( Vec_IntSize(pGia->vTtNodes) > 0 );

    // collect GIA nodes for leaves
    Vec_IntClear( p->vLabels );
    for (i = 0; i < nLeaves; i++)
        Vec_IntPush( p->vLabels, Abc_LitNotCond(Vec_IntEntry(vLeaves, pCanonPerm[i]), (uCanonPhase >> i) & 1) );

    // compute HOP nodes for internal nodes
    Gia_ManForEachObjVec( pGia->vTtNodes, pGia, pGiaTemp, i )
    {
        pGiaTemp->fMark0 = 0; // unmark node marked by Gia_ObjCollectInternal()
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pGiaTemp)) )
            iFan0 = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, Gia_ObjFanin0(pGiaTemp)) + nLeaves);
        else
            iFan0 = Vec_IntEntry(p->vLabels, Gia_ObjCioId(Gia_ObjFanin0(pGiaTemp)));
        iFan0 = Abc_LitNotCond(iFan0, Gia_ObjFaninC0(pGiaTemp));
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pGiaTemp)) )
            iFan1 = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, Gia_ObjFanin1(pGiaTemp)) + nLeaves);
        else
            iFan1 = Vec_IntEntry(p->vLabels, Gia_ObjCioId(Gia_ObjFanin1(pGiaTemp)));
        iFan1 = Abc_LitNotCond(iFan1, Gia_ObjFaninC1(pGiaTemp));
        if ( fHash )
            iGiaObj = Gia_ManHashAnd(pMan, iFan0, iFan1);
        else
            iGiaObj = Gia_ManAppendAnd(pMan, iFan0, iFan1);
        Vec_IntPush(p->vLabels, iGiaObj);
    }
    // get the final result
    assert( Gia_ObjIsAnd(pGiaTemp) );
    iGiaObj = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, pGiaTemp) + nLeaves);
    // complement the result if needed
    return Abc_LitNotCond( iGiaObj,  Gia_ObjFaninC0(pGiaPo) ^ ((uCanonPhase >> nLeaves) & 1) ^ pCut->fCompl );    
}